

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>::replay
          (parse_event<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor)

{
  string_view_type local_18;
  ser_context local_8;
  
  switch(this->event_type) {
  case string_value:
    local_18._M_str = (this->string_value)._M_dataplus._M_p;
    local_18._M_len = (this->string_value)._M_string_length;
    local_8._vptr_ser_context = (_func_int **)&PTR__ser_context_00b2f9c8;
    basic_json_visitor<char>::string_value(visitor,&local_18,this->tag,&local_8);
    break;
  case byte_string_value:
    local_18._M_len = (size_t)&PTR__ser_context_00b2f9c8;
    basic_json_visitor<char>::
    byte_string_value<jsoncons::basic_byte_string<std::allocator<unsigned_char>>>
              (visitor,&this->byte_string_value,this->tag,(ser_context *)&local_18,0);
    break;
  case null_value:
    local_18._M_len = (size_t)&PTR__ser_context_00b2f9c8;
    basic_json_visitor<char>::null_value(visitor,this->tag,(ser_context *)&local_18);
    break;
  case bool_value:
    local_18._M_len = (size_t)&PTR__ser_context_00b2f9c8;
    basic_json_visitor<char>::bool_value
              (visitor,(this->field_3).bool_value,this->tag,(ser_context *)&local_18);
    break;
  case int64_value:
    local_18._M_len = (size_t)&PTR__ser_context_00b2f9c8;
    basic_json_visitor<char>::int64_value
              (visitor,(this->field_3).int64_value,this->tag,(ser_context *)&local_18);
    break;
  case uint64_value:
    local_18._M_len = (size_t)&PTR__ser_context_00b2f9c8;
    basic_json_visitor<char>::uint64_value
              (visitor,(this->field_3).uint64_value,this->tag,(ser_context *)&local_18);
    break;
  case double_value:
    local_18._M_len = (size_t)&PTR__ser_context_00b2f9c8;
    basic_json_visitor<char>::double_value
              (visitor,(this->field_3).double_value,this->tag,(ser_context *)&local_18);
    break;
  case begin_array:
    local_18._M_len = (size_t)&PTR__ser_context_00b2f9c8;
    basic_json_visitor<char>::begin_array(visitor,this->tag,(ser_context *)&local_18);
    break;
  case end_array:
    local_18._M_len = (size_t)&PTR__ser_context_00b2f9c8;
    basic_json_visitor<char>::end_array(visitor,(ser_context *)&local_18);
  }
  return;
}

Assistant:

void replay(basic_json_visitor<CharT>& visitor) const
        {
            switch (event_type)
            {
                case staj_event_type::begin_array:
                    visitor.begin_array(tag, ser_context());
                    break;
                case staj_event_type::end_array:
                    visitor.end_array(ser_context());
                    break;
                case staj_event_type::string_value:
                    visitor.string_value(string_value, tag, ser_context());
                    break;
                case staj_event_type::byte_string_value:
                    visitor.byte_string_value(byte_string_value, tag, ser_context());
                    break;
                case staj_event_type::null_value:
                    visitor.null_value(tag, ser_context());
                    break;
                case staj_event_type::bool_value:
                    visitor.bool_value(bool_value, tag, ser_context());
                    break;
                case staj_event_type::int64_value:
                    visitor.int64_value(int64_value, tag, ser_context());
                    break;
                case staj_event_type::uint64_value:
                    visitor.uint64_value(uint64_value, tag, ser_context());
                    break;
                case staj_event_type::double_value:
                    visitor.double_value(double_value, tag, ser_context());
                    break;
                default:
                    break;
            }
        }